

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object_iterator.c
# Opt level: O2

int main(int atgc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 in_register_0000003c;
  json_object_iterator itEnd;
  undefined8 local_28;
  undefined8 local_20;
  
  json_object_iter_init_default(CONCAT44(in_register_0000003c,atgc));
  uVar2 = json_tokener_parse(
                            "{\n\t\t\"string_of_digits\": \"123\",\n\t\t\"regular_number\": 222,\n\t\t\"decimal_number\": 99.55,\n\t\t\"boolean_true\": true,\n\t\t\"boolean_false\": false,\n\t\t\"big_number\": 2147483649,\n\t\t\"a_null\": null,\n\t\t}"
                            );
  local_20 = json_object_iter_begin(uVar2);
  local_28 = json_object_iter_end(uVar2);
  while( true ) {
    iVar1 = json_object_iter_equal(&local_20,&local_28);
    if (iVar1 != 0) break;
    pcVar3 = (char *)json_object_iter_peek_name(&local_20);
    puts(pcVar3);
    uVar4 = json_object_iter_peek_value(&local_20);
    pcVar3 = (char *)json_object_to_json_string(uVar4);
    puts(pcVar3);
    json_object_iter_next(&local_20);
  }
  json_object_put(uVar2);
  return 0;
}

Assistant:

int main(int atgc, char **argv)
{
	const char *input = "{\n\
		\"string_of_digits\": \"123\",\n\
		\"regular_number\": 222,\n\
		\"decimal_number\": 99.55,\n\
		\"boolean_true\": true,\n\
		\"boolean_false\": false,\n\
		\"big_number\": 2147483649,\n\
		\"a_null\": null,\n\
		}";

	struct json_object *new_obj;
	struct json_object_iterator it;
	struct json_object_iterator itEnd;

	it = json_object_iter_init_default();
	new_obj = json_tokener_parse(input);
	it = json_object_iter_begin(new_obj);
	itEnd = json_object_iter_end(new_obj);

	while (!json_object_iter_equal(&it, &itEnd))
	{
		printf("%s\n", json_object_iter_peek_name(&it));
		printf("%s\n", json_object_to_json_string(json_object_iter_peek_value(&it)));
		json_object_iter_next(&it);
	}

	json_object_put(new_obj);

	return 0;
}